

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

type_error *
nlohmann::detail::type_error::create(type_error *__return_storage_ptr__,int id_,string *what_arg)

{
  long *plVar1;
  long *plVar2;
  string w;
  long *local_80;
  long local_70;
  long lStack_68;
  string local_60;
  string local_40;
  
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"type_error","");
  exception::name(&local_40,&local_60,id_);
  plVar1 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_40,(ulong)(what_arg->_M_dataplus)._M_p);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_70 = *plVar2;
    lStack_68 = plVar1[3];
    local_80 = &local_70;
  }
  else {
    local_70 = *plVar2;
    local_80 = (long *)*plVar1;
  }
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  exception::exception(&__return_storage_ptr__->super_exception,id_,(char *)local_80);
  *(undefined ***)&__return_storage_ptr__->super_exception = &PTR__exception_001a2bd0;
  if (local_80 != &local_70) {
    operator_delete(local_80,local_70 + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static type_error create(int id_, const std::string& what_arg)
{
std::string w = exception::name("type_error", id_) + what_arg;
return type_error(id_, w.c_str());
}